

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_textedit_locate_coord(nk_text_edit *edit,float x,float y,nk_user_font *font,float row_height)

{
  bool bVar1;
  int iVar2;
  nk_str *str;
  int iVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int len;
  nk_rune unicode;
  nk_text_edit_row r;
  int local_60;
  float local_5c;
  nk_rune local_58;
  float local_54;
  nk_text_edit_row local_50;
  nk_str *local_38;
  
  iVar6 = (edit->string).len;
  iVar3 = 0;
  local_50.x0 = 0.0;
  local_50.x1 = 0.0;
  local_50.ymin = 0.0;
  local_50.ymax = 0.0;
  local_50.num_chars = 0;
  bVar1 = 0 < iVar6;
  if (iVar6 < 1) {
    return iVar6;
  }
  local_38 = &edit->string;
  fVar9 = 0.0;
  local_5c = x;
  local_54 = row_height;
  while( true ) {
    nk_textedit_layout_row(&local_50,edit,iVar3,local_54,font);
    str = local_38;
    iVar2 = local_50.num_chars;
    if (local_50.num_chars < 1) {
      return iVar6;
    }
    if ((iVar3 == 0) && (y < local_50.ymin + fVar9)) {
      return 0;
    }
    if (y < local_50.ymax + fVar9) break;
    fVar9 = fVar9 + local_50.baseline_y_delta;
    iVar3 = local_50.num_chars + iVar3;
    bVar1 = iVar3 < iVar6;
    if (iVar6 <= iVar3) {
      return iVar6;
    }
  }
  if (!bVar1) {
    return iVar6;
  }
  if (local_5c < local_50.x0) {
    return iVar3;
  }
  iVar5 = iVar3;
  if (local_5c < local_50.x1) {
    if (local_50.num_chars < 1) {
      iVar5 = 0;
    }
    else {
      iVar7 = 0;
      fVar9 = local_50.x0;
      do {
        local_60 = 0;
        local_58 = 0;
        iVar5 = iVar3 + iVar7;
        pcVar4 = nk_str_at_const(str,iVar5,&local_58,&local_60);
        fVar8 = (*font->width)(font->userdata,font->height,pcVar4,local_60);
        fVar10 = fVar9 + fVar8;
        fVar11 = fVar10;
        if ((local_5c < fVar10) && (fVar11 = fVar9, iVar6 = iVar5, fVar8 * 0.5 + fVar9 <= local_5c))
        {
          iVar6 = iVar5 + 1;
        }
        if (local_5c < fVar10) {
          return iVar6;
        }
        iVar7 = iVar7 + 1;
        fVar9 = fVar11;
        iVar5 = iVar2;
      } while (iVar2 != iVar7);
    }
  }
  iVar6 = local_50.num_chars + iVar5;
  iVar3 = iVar5 + local_50.num_chars + -1;
  local_58 = 0;
  nk_str_at_const(str,iVar3,&local_58,&local_60);
  if (local_58 == 10) {
    iVar6 = iVar3;
  }
  return iVar6;
}

Assistant:

NK_INTERN int
nk_textedit_locate_coord(struct nk_text_edit *edit, float x, float y,
    const struct nk_user_font *font, float row_height)
{
    struct nk_text_edit_row r;
    int n = edit->string.len;
    float base_y = 0, prev_x;
    int i=0, k;

    r.x0 = r.x1 = 0;
    r.ymin = r.ymax = 0;
    r.num_chars = 0;

    /* search rows to find one that straddles 'y' */
    while (i < n) {
        nk_textedit_layout_row(&r, edit, i, row_height, font);
        if (r.num_chars <= 0)
            return n;

        if (i==0 && y < base_y + r.ymin)
            return 0;

        if (y < base_y + r.ymax)
            break;

        i += r.num_chars;
        base_y += r.baseline_y_delta;
    }

    /* below all text, return 'after' last character */
    if (i >= n)
        return n;

    /* check if it's before the beginning of the line */
    if (x < r.x0)
        return i;

    /* check if it's before the end of the line */
    if (x < r.x1) {
        /* search characters in row for one that straddles 'x' */
        k = i;
        prev_x = r.x0;
        for (i=0; i < r.num_chars; ++i) {
            float w = nk_textedit_get_width(edit, k, i, font);
            if (x < prev_x+w) {
                if (x < prev_x+w/2)
                    return k+i;
                else return k+i+1;
            }
            prev_x += w;
        }
        /* shouldn't happen, but if it does, fall through to end-of-line case */
    }

    /* if the last character is a newline, return that.
     * otherwise return 'after' the last character */
    if (nk_str_rune_at(&edit->string, i+r.num_chars-1) == '\n')
        return i+r.num_chars-1;
    else return i+r.num_chars;
}